

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFlatImageIO.cpp
# Opt level: O0

void Imf_3_2::anon_unknown_27::loadLevel(TiledInputFile *in,FlatImage *img,int x,int y)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  string *psVar4;
  FlatImageChannel *pFVar5;
  undefined4 in_ECX;
  int in_EDX;
  long *in_RSI;
  int iVar6;
  FrameBuffer *in_RDI;
  ConstIterator i;
  FrameBuffer fb;
  FlatImageLevel *level;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  ConstIterator *in_stack_ffffffffffffff00;
  undefined1 local_b8 [56];
  iterator local_80;
  iterator local_60;
  string local_50 [48];
  undefined8 local_20;
  int local_14;
  FrameBuffer *local_8;
  
  local_14 = in_EDX;
  local_8 = in_RDI;
  local_20 = (**(code **)(*in_RSI + 0x28))(in_RSI,in_EDX,in_ECX);
  FrameBuffer::FrameBuffer((FrameBuffer *)0x12e879);
  local_60._M_node =
       (_Base_ptr)
       FlatImageLevel::begin
                 ((FlatImageLevel *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  FlatImageLevel::ConstIterator::ConstIterator
            (in_stack_ffffffffffffff00,
             (Iterator *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  while( true ) {
    local_80._M_node =
         (_Base_ptr)
         FlatImageLevel::end((FlatImageLevel *)
                             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    FlatImageLevel::ConstIterator::ConstIterator
              (in_stack_ffffffffffffff00,
               (Iterator *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    bVar1 = operator!=(in_stack_ffffffffffffff00,
                       (ConstIterator *)
                       CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    if (!bVar1) break;
    psVar4 = FlatImageLevel::ConstIterator::name_abi_cxx11_((ConstIterator *)0x12e925);
    pFVar5 = FlatImageLevel::ConstIterator::channel((ConstIterator *)0x12e934);
    (*(pFVar5->super_ImageChannel)._vptr_ImageChannel[4])(local_b8);
    Imf_3_2::FrameBuffer::insert(local_50,(Slice *)psVar4);
    FlatImageLevel::ConstIterator::operator++(in_stack_ffffffffffffff00);
  }
  Imf_3_2::TiledInputFile::setFrameBuffer(local_8);
  iVar6 = (int)local_8;
  local_8._0_4_ = iVar6;
  iVar2 = Imf_3_2::TiledInputFile::numXTiles(iVar6);
  iVar3 = Imf_3_2::TiledInputFile::numYTiles((int)local_8);
  Imf_3_2::TiledInputFile::readTiles(iVar6,0,iVar2 + -1,0,iVar3 + -1,local_14);
  FrameBuffer::~FrameBuffer((FrameBuffer *)0x12ea31);
  return;
}

Assistant:

void
loadLevel (TiledInputFile& in, FlatImage& img, int x, int y)
{
    FlatImageLevel& level = img.level (x, y);
    FrameBuffer     fb;

    for (FlatImageLevel::ConstIterator i = level.begin (); i != level.end ();
         ++i)
        fb.insert (i.name (), i.channel ().slice ());

    in.setFrameBuffer (fb);
    in.readTiles (0, in.numXTiles (x) - 1, 0, in.numYTiles (y) - 1, x, y);
}